

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfskmsscreen.cpp
# Opt level: O0

void __thiscall
QEglFSKmsScreen::QEglFSKmsScreen
          (QEglFSKmsScreen *this,QEglFSKmsDevice *device,QKmsOutput *output,bool headless)

{
  bool bVar1;
  QPlatformIntegration *this_00;
  EGLDisplay pvVar2;
  QEglFSKmsScreen *screen;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  byte in_CL;
  undefined8 in_RSI;
  QEglFSKmsInterruptHandler *in_RDI;
  long in_FS_OFFSET;
  qreal qVar7;
  qreal qVar8;
  QByteArray edid;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QKmsOutput *in_stack_fffffffffffffe08;
  QKmsOutput *in_stack_fffffffffffffe10;
  int line;
  QString *in_stack_fffffffffffffe18;
  QMessageLogger *in_stack_fffffffffffffe20;
  QDebug *in_stack_fffffffffffffe28;
  undefined1 local_180 [56];
  QDebug local_148;
  undefined1 local_140 [56];
  QDebug local_108 [13];
  undefined1 local_a0 [48];
  char local_70 [32];
  QByteArray local_50;
  undefined8 local_38;
  ulong local_30;
  undefined8 local_28;
  ulong local_20;
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = QGuiApplicationPrivate::platformIntegration();
  pvVar2 = QEglFSIntegration::display((QEglFSIntegration *)this_00);
  QEglFSScreen::QEglFSScreen((QEglFSScreen *)in_RDI,pvVar2);
  *(undefined ***)in_RDI = &PTR__QEglFSKmsScreen_001471c0;
  *(undefined8 *)&in_RDI[1].field_0x8 = in_RSI;
  QKmsOutput::QKmsOutput(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  QEdidParser::QEdidParser((QEdidParser *)in_stack_fffffffffffffe10);
  QPoint::QPoint((QPoint *)in_stack_fffffffffffffe10);
  *(undefined1 *)&in_RDI[0xf].m_screen = 0;
  QList<QPlatformScreen_*>::QList((QList<QPlatformScreen_*> *)0x10d4cb);
  *(undefined4 *)&in_RDI[0x10].m_screen = 0;
  screen = (QEglFSKmsScreen *)operator_new(0x20);
  QEglFSKmsInterruptHandler::QEglFSKmsInterruptHandler(in_RDI,screen);
  *(QEglFSKmsScreen **)(in_RDI + 0x11) = screen;
  in_RDI[0x11].field_0x8 = in_CL & 1;
  QList<QPlatformScreen_*>::operator<<
            ((QList<QPlatformScreen_*> *)in_stack_fffffffffffffe10,
             (parameter_type)in_stack_fffffffffffffe08);
  if (*(long *)&in_RDI[5].field_0x8 == 0) {
    local_38 = 0xaaaaaaaaaaaaaaaa;
    local_30 = 0xaaaaaaaaaaaaaaaa;
    QtPrivateLogging::qLcEglfsKmsDebug();
    anon_unknown.dwarf_5a738::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_fffffffffffffe10,
               (QLoggingCategory *)in_stack_fffffffffffffe08);
    while( true ) {
      line = (int)((ulong)in_stack_fffffffffffffe10 >> 0x20);
      bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                        ((QLoggingCategoryMacroHolder *)&local_38);
      if (!bVar1) break;
      anon_unknown.dwarf_5a738::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x10d933);
      QMessageLogger::QMessageLogger
                (in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18,line,
                 (char *)in_stack_fffffffffffffe08,(char *)0x10d94c);
      QMessageLogger::debug();
      in_stack_fffffffffffffe10 =
           (QKmsOutput *)QDebug::operator<<(in_stack_fffffffffffffe28,(char *)in_RDI);
      (**(code **)(*(long *)in_RDI + 0x90))(local_180);
      QDebug::operator<<((QDebug *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      QString::~QString((QString *)0x10d9a6);
      QDebug::~QDebug(&local_148);
      local_30 = local_30 & 0xffffffffffffff00;
    }
  }
  else {
    local_50.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_50.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
    local_50.d.size = -0x5555555555555556;
    QByteArray::QByteArray
              (&local_50,*(char **)(*(long *)&in_RDI[5].field_0x8 + 8),
               (ulong)*(uint *)(*(long *)&in_RDI[5].field_0x8 + 4));
    uVar3 = QEdidParser::parse((QByteArray *)&in_RDI[8].m_screen);
    if ((uVar3 & 1) == 0) {
      local_28 = 0xaaaaaaaaaaaaaaaa;
      local_20 = 0xaaaaaaaaaaaaaaaa;
      QtPrivateLogging::qLcEglfsKmsDebug();
      anon_unknown.dwarf_5a738::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_fffffffffffffe10,
                 (QLoggingCategory *)in_stack_fffffffffffffe08);
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_28), bVar1) {
        anon_unknown.dwarf_5a738::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x10d833);
        QMessageLogger::QMessageLogger
                  (in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18,
                   (int)((ulong)in_stack_fffffffffffffe10 >> 0x20),(char *)in_stack_fffffffffffffe08
                   ,(char *)0x10d84c);
        QMessageLogger::debug();
        in_stack_fffffffffffffe18 =
             (QString *)QDebug::operator<<(in_stack_fffffffffffffe28,(char *)in_RDI);
        (**(code **)(*(long *)in_RDI + 0x90))(local_140);
        QDebug::operator<<((QDebug *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
        QString::~QString((QString *)0x10d8af);
        QDebug::~QDebug(local_108);
        local_20 = local_20 & 0xffffffffffffff00;
      }
    }
    else {
      local_18 = 0xaaaaaaaaaaaaaaaa;
      local_10 = 0xaaaaaaaaaaaaaaaa;
      QtPrivateLogging::qLcEglfsKmsDebug();
      anon_unknown.dwarf_5a738::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_fffffffffffffe10,
                 (QLoggingCategory *)in_stack_fffffffffffffe08);
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
        anon_unknown.dwarf_5a738::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x10d603);
        QMessageLogger::QMessageLogger
                  (in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18,
                   (int)((ulong)in_stack_fffffffffffffe10 >> 0x20),(char *)in_stack_fffffffffffffe08
                   ,(char *)0x10d61c);
        (**(code **)(*(long *)in_RDI + 0x90))(local_a0);
        QString::toLatin1(&in_stack_fffffffffffffe08->name);
        in_stack_fffffffffffffe20 = (QMessageLogger *)QByteArray::constData((QByteArray *)0x10d654);
        QString::toLatin1(&in_stack_fffffffffffffe08->name);
        pcVar4 = QByteArray::constData((QByteArray *)0x10d67f);
        QString::toLatin1(&in_stack_fffffffffffffe08->name);
        pcVar5 = QByteArray::constData((QByteArray *)0x10d6ae);
        QString::toLatin1(&in_stack_fffffffffffffe08->name);
        pcVar6 = QByteArray::constData((QByteArray *)0x10d6dd);
        QString::toLatin1(&in_stack_fffffffffffffe08->name);
        in_stack_fffffffffffffe08 = (QKmsOutput *)QByteArray::constData((QByteArray *)0x10d70c);
        qVar7 = QSizeF::width((QSizeF *)&in_RDI[0xb].m_screen);
        qVar8 = QSizeF::height((QSizeF *)&in_RDI[0xb].m_screen);
        QMessageLogger::debug
                  (local_70,qVar7,SUB84(qVar8,0),
                   "EDID data for output \"%s\": identifier \'%s\', manufacturer \'%s\', model \'%s\', serial \'%s\', physical size: %.2fx%.2f"
                   ,in_stack_fffffffffffffe20,pcVar4,pcVar5,pcVar6);
        QByteArray::~QByteArray((QByteArray *)0x10d78a);
        QByteArray::~QByteArray((QByteArray *)0x10d797);
        QByteArray::~QByteArray((QByteArray *)0x10d7a4);
        QByteArray::~QByteArray((QByteArray *)0x10d7b1);
        QByteArray::~QByteArray((QByteArray *)0x10d7be);
        QString::~QString((QString *)0x10d7cb);
        local_10 = local_10 & 0xffffffffffffff00;
      }
    }
    QByteArray::~QByteArray((QByteArray *)0x10d8d8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QEglFSKmsScreen::QEglFSKmsScreen(QEglFSKmsDevice *device, const QKmsOutput &output, bool headless)
    : QEglFSScreen(static_cast<QEglFSIntegration *>(QGuiApplicationPrivate::platformIntegration())->display())
    , m_device(device)
    , m_output(output)
    , m_cursorOutOfRange(false)
    , m_powerState(PowerStateOn)
    , m_interruptHandler(new QEglFSKmsInterruptHandler(this))
    , m_headless(headless)
{
    m_siblings << this; // gets overridden later

    if (m_output.edid_blob) {
        QByteArray edid(reinterpret_cast<const char *>(m_output.edid_blob->data), m_output.edid_blob->length);
        if (m_edid.parse(edid))
            qCDebug(qLcEglfsKmsDebug, "EDID data for output \"%s\": identifier '%s', manufacturer '%s', model '%s', serial '%s', physical size: %.2fx%.2f",
                    name().toLatin1().constData(),
                    m_edid.identifier.toLatin1().constData(),
                    m_edid.manufacturer.toLatin1().constData(),
                    m_edid.model.toLatin1().constData(),
                    m_edid.serialNumber.toLatin1().constData(),
                    m_edid.physicalSize.width(), m_edid.physicalSize.height());
        else
            qCDebug(qLcEglfsKmsDebug) << "Failed to parse EDID data for output" << name(); // keep this debug, not warning
    } else {
        qCDebug(qLcEglfsKmsDebug) << "No EDID data for output" << name();
    }
}